

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O0

uint64_t aom_var_2d_u16_c(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  uint16_t v;
  uint64_t s;
  uint64_t ss;
  int c;
  int r;
  uint16_t *srcp;
  int height_local;
  int width_local;
  int src_stride_local;
  uint8_t *src_local;
  
  srcp = (uint16_t *)((long)src << 1);
  ss = 0;
  s = 0;
  for (r = 0; r < height; r = r + 1) {
    for (c = 0; c < width; c = c + 1) {
      uVar1 = srcp[c];
      ss = (long)(int)((uint)uVar1 * (uint)uVar1) + ss;
      s = uVar1 + s;
    }
    srcp = srcp + src_stride;
  }
  return ss - (s * s) / (ulong)(long)(width * height);
}

Assistant:

uint64_t aom_var_2d_u16_c(uint8_t *src, int src_stride, int width, int height) {
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint16_t v = srcp[c];
      ss += v * v;
      s += v;
    }
    srcp += src_stride;
  }

  return (ss - s * s / (width * height));
}